

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_>::Write
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_> *this,TPZStream *buf,
          int withclassid)

{
  TPZGeoEl::Write(&this->super_TPZGeoEl,buf,withclassid);
  pzgeom::TPZGeoPoint::Write(&(this->fGeo).super_TPZGeoPoint,buf,withclassid);
  (*(this->fGeo).fNeighbours[0].super_TPZSavable._vptr_TPZSavable[5])
            ((this->fGeo).fNeighbours,buf,(ulong)(uint)withclassid);
  (**(code **)(*(long *)&(this->fGeo).field_0x30 + 0x28))(&(this->fGeo).field_0x30,buf,withclassid);
  (*this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable[5])
            (this->fNeighbours,buf,(ulong)(uint)withclassid);
  return;
}

Assistant:

void TPZGeoElRefLess<TGeo>::Write(TPZStream &buf, int withclassid) const {
    TPZGeoEl::Write(buf, withclassid);
    fGeo.Write(buf, withclassid);
    for (unsigned int i = 0; i < TGeo::NSides; ++i) {
        this->fNeighbours[i].Write(buf, withclassid);
    }
}